

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O0

bool upb_test_MapTest_map_string_double_set
               (upb_test_MapTest *msg,upb_StringView key,double val,upb_Arena *a)

{
  upb_MapInsertStatus uVar1;
  upb_Map *map_00;
  upb_Map *map;
  upb_MiniTableField field;
  upb_Arena *a_local;
  double val_local;
  upb_test_MapTest *msg_local;
  upb_StringView key_local;
  
  key_local.data = (char *)key.size;
  msg_local = (upb_test_MapTest *)key.data;
  stack0xffffffffffffffc4 = 0x800000001;
  field.number_dont_copy_me__upb_internal_use_only = 0xc00b0000;
  field._4_8_ = a;
  a_local = (upb_Arena *)val;
  val_local = (double)msg;
  _upb_MiniTable_StrongReference_dont_copy_me__upb_internal_use_only
            (&upb_0test__MapTest__MapStringDoubleEntry_msg_init);
  map_00 = _upb_Message_GetOrCreateMutableMap
                     ((upb_Message *)val_local,(upb_MiniTableField *)((long)&map + 4),0,8,
                      (upb_Arena *)field._4_8_);
  uVar1 = _upb_Map_Insert(map_00,&msg_local,0,&a_local,8,(upb_Arena *)field._4_8_);
  return uVar1 != kUpb_MapInsertStatus_OutOfMemory;
}

Assistant:

UPB_INLINE bool upb_test_MapTest_map_string_double_set(upb_test_MapTest* msg, upb_StringView key, double val, upb_Arena* a) {
  const upb_MiniTableField field = {1, 8, 0, 0, 11, (int)kUpb_FieldMode_Map | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&upb_0test__MapTest__MapStringDoubleEntry_msg_init);
  upb_Map* map = _upb_Message_GetOrCreateMutableMap(UPB_UPCAST(msg),
                                                    &field, 0, sizeof(val), a);
  return _upb_Map_Insert(map, &key, 0, &val, sizeof(val), a) !=
         kUpb_MapInsertStatus_OutOfMemory;
}